

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  pointer *ppUVar1;
  iterator __position;
  undefined1 auStack_28 [8];
  UnknownField field;
  
  auStack_28._4_4_ = 3;
  auStack_28._0_4_ = number;
  field._0_8_ = operator_new(0x20);
  (((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
   &((string *)field._0_8_)->_M_dataplus)->
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&((string *)field._0_8_)->field_2;
  ((string *)field._0_8_)->_M_string_length = 0;
  (((string *)field._0_8_)->field_2)._M_local_buf[0] = '\0';
  __position._M_current =
       (this->fields_).
       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>
              ((vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
                *)this,__position,(UnknownField *)auStack_28);
  }
  else {
    (__position._M_current)->number_ = auStack_28._0_4_;
    (__position._M_current)->type_ = auStack_28._4_4_;
    ((__position._M_current)->data_).group_ = (UnknownFieldSet *)field._0_8_;
    ppUVar1 = &(this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return (string *)field._0_8_;
}

Assistant:

std::string* UnknownFieldSet::AddLengthDelimited(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_LENGTH_DELIMITED);
  field.data_.length_delimited_.string_value = new std::string;
  fields_.push_back(field);
  return field.data_.length_delimited_.string_value;
}